

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O1

void deqp::gls::ub::anon_unknown_12::computeStd140Layout
               (UniformLayout *layout,int *curOffset,int curBlockNdx,string *curPrefix,VarType *type
               ,deUint32 layoutFlags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VarType *pVVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  DataType DVar6;
  int iVar7;
  DataType dataType;
  undefined4 extraout_var;
  undefined8 *puVar8;
  long *plVar9;
  size_type *psVar10;
  ulong *puVar11;
  uint uVar12;
  ulong uVar13;
  pointer pSVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  UniformLayoutEntry entry;
  string local_240;
  VarType *local_220;
  UniformLayout *local_218;
  long *local_210;
  undefined8 local_208;
  long local_200;
  undefined8 uStack_1f8;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  uint local_1cc;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8 [2];
  value_type local_1a8;
  ios_base local_138 [264];
  
  local_218 = layout;
  iVar4 = computeStd140BaseAlignment(type);
  local_1cc = -iVar4;
  *curOffset = (*curOffset + iVar4) - 1U & local_1cc;
  if (type->m_type == TYPE_ARRAY) {
    pVVar2 = (type->m_data).array.elementType;
    if (pVVar2->m_type != TYPE_BASIC) {
LAB_0188cb0c:
      if ((type->m_data).array.size < 1) {
        return;
      }
      iVar4 = 0;
      local_220 = (VarType *)curOffset;
      do {
        local_1f0 = local_1e0;
        pcVar3 = (curPrefix->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f0,pcVar3,pcVar3 + curPrefix->_M_string_length);
        std::__cxx11::string::append((char *)&local_1f0);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::ostream::operator<<(&local_1a8,iVar4);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar13 = 0xf;
        if (local_1f0 != local_1e0) {
          uVar13 = local_1e0[0];
        }
        if (uVar13 < (ulong)(local_1c0 + local_1e8)) {
          uVar13 = 0xf;
          if (local_1c8 != local_1b8) {
            uVar13 = local_1b8[0];
          }
          if (uVar13 < (ulong)(local_1c0 + local_1e8)) goto LAB_0188cbf3;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,(ulong)local_1f0);
        }
        else {
LAB_0188cbf3:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_1c8);
        }
        local_210 = &local_200;
        plVar9 = puVar8 + 2;
        if ((long *)*puVar8 == plVar9) {
          local_200 = *plVar9;
          uStack_1f8 = puVar8[3];
        }
        else {
          local_200 = *plVar9;
          local_210 = (long *)*puVar8;
        }
        local_208 = puVar8[1];
        *puVar8 = plVar9;
        puVar8[1] = 0;
        *(undefined1 *)plVar9 = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_210);
        psVar10 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_240.field_2._M_allocated_capacity = *psVar10;
          local_240.field_2._8_8_ = plVar9[3];
          local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        }
        else {
          local_240.field_2._M_allocated_capacity = *psVar10;
          local_240._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_240._M_string_length = plVar9[1];
        *plVar9 = (long)psVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        computeStd140Layout(local_218,(int *)local_220,curBlockNdx,&local_240,
                            (type->m_data).array.elementType,layoutFlags);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        if (local_210 != &local_200) {
          operator_delete(local_210,local_200 + 1);
        }
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        if (local_1f0 != local_1e0) {
          operator_delete(local_1f0,local_1e0[0] + 1);
        }
        iVar4 = iVar4 + 1;
        if ((type->m_data).array.size <= iVar4) {
          return;
        }
      } while( true );
    }
    DVar6 = (pVVar2->m_data).basicType;
    local_220 = type;
    if (DVar6 - TYPE_DOUBLE_MAT2 < 9 || DVar6 - TYPE_FLOAT_MAT2 < 9) {
      DVar6 = (pVVar2->m_data).basicType;
      if (8 < DVar6 - TYPE_FLOAT_MAT2 && 8 < DVar6 - TYPE_DOUBLE_MAT2) goto LAB_0188cb0c;
      if ((layoutFlags & 0x40) == 0) {
        iVar4 = glu::getDataTypeMatrixNumRows(DVar6);
        iVar5 = glu::getDataTypeMatrixNumColumns(DVar6);
      }
      else {
        iVar4 = glu::getDataTypeMatrixNumColumns(DVar6);
        iVar5 = glu::getDataTypeMatrixNumRows(DVar6);
      }
      dataType = glu::getDataTypeFloatVec(iVar4);
      iVar7 = glu::getDataTypeScalarSize(dataType);
      iVar4 = 0x10;
      if (0x10 < iVar7 * 4) {
        iVar4 = iVar7 * 4;
      }
      local_1a8.name._M_dataplus._M_p = (pointer)&local_1a8.name.field_2;
      local_1a8.name._M_string_length = 0;
      local_1a8.name.field_2._M_allocated_capacity =
           local_1a8.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_1a8.type = TYPE_LAST;
      local_1a8.size = 0;
      local_1a8.blockNdx = -1;
      local_1a8.offset = -1;
      local_1a8.arrayStride = -1;
      local_1a8.matrixStride = -1;
      local_1a8.isRowMajor = false;
      pcVar3 = (curPrefix->_M_dataplus)._M_p;
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_240,pcVar3,pcVar3 + curPrefix->_M_string_length);
      std::__cxx11::string::append((char *)&local_240);
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_240);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      local_1a8.offset = *curOffset;
      local_1a8.size = (local_220->m_data).array.size;
      local_1a8.type = DVar6;
      local_1a8.matrixStride = iVar4;
      local_1a8.arrayStride = iVar5 * iVar4;
      local_1a8.isRowMajor = SUB41((layoutFlags & 0x40) >> 6,0);
      *curOffset = iVar5 * iVar4 * local_1a8.size + local_1a8.offset;
      local_1a8.blockNdx = curBlockNdx;
      std::
      vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
      ::push_back(&local_218->uniforms,&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8.name._M_dataplus._M_p == &local_1a8.name.field_2) {
        return;
      }
    }
    else {
      paVar1 = &local_1a8.name.field_2;
      local_1a8.name._M_string_length = 0;
      local_1a8.name.field_2._M_allocated_capacity =
           (ulong)(uint7)local_1a8.name.field_2._M_allocated_capacity._1_7_ << 8;
      local_1a8.type = TYPE_LAST;
      local_1a8.size = 0;
      local_1a8.blockNdx = -1;
      local_1a8.offset = -1;
      local_1a8.arrayStride = -1;
      local_1a8.matrixStride = -1;
      local_1a8.isRowMajor = false;
      local_1a8.name._M_dataplus._M_p = (pointer)paVar1;
      iVar4 = glu::getDataTypeScalarSize(DVar6);
      uVar12 = 0x10;
      if (0x10 < iVar4 * 4) {
        uVar12 = iVar4 * 4;
      }
      pcVar3 = (curPrefix->_M_dataplus)._M_p;
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_240,pcVar3,pcVar3 + curPrefix->_M_string_length);
      std::__cxx11::string::append((char *)&local_240);
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_240);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      local_1a8.offset = *curOffset;
      local_1a8.size = (local_220->m_data).array.size;
      local_1a8.type = DVar6;
      local_1a8.matrixStride = 0;
      local_1a8.arrayStride = uVar12;
      *curOffset = local_1a8.size * uVar12 + local_1a8.offset;
      local_1a8.blockNdx = curBlockNdx;
      std::
      vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
      ::push_back(&local_218->uniforms,&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8.name._M_dataplus._M_p == paVar1) {
        return;
      }
    }
  }
  else {
    if (type->m_type != TYPE_BASIC) {
      pSVar14 = (((type->m_data).structPtr)->m_members).
                super__Vector_base<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_220 = (VarType *)CONCAT44(extraout_var,iVar4);
      if (pSVar14 !=
          (((type->m_data).structPtr)->m_members).
          super__Vector_base<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        paVar1 = &local_1a8.name.field_2;
        do {
          local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
          pcVar3 = (curPrefix->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_240,pcVar3,pcVar3 + curPrefix->_M_string_length);
          std::__cxx11::string::append((char *)&local_240);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_240);
          puVar11 = (ulong *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_1a8.name.field_2._M_allocated_capacity = *puVar11;
            local_1a8.name.field_2._8_8_ = plVar9[3];
            local_1a8.name._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_1a8.name.field_2._M_allocated_capacity = *puVar11;
            local_1a8.name._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_1a8.name._M_string_length = plVar9[1];
          *plVar9 = (long)puVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          computeStd140Layout(local_218,curOffset,curBlockNdx,&local_1a8.name,&pSVar14->m_type,
                              layoutFlags);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8.name._M_dataplus._M_p != paVar1) {
            operator_delete(local_1a8.name._M_dataplus._M_p,
                            local_1a8.name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
          }
          pSVar14 = pSVar14 + 1;
        } while (pSVar14 !=
                 (((type->m_data).structPtr)->m_members).
                 super__Vector_base<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      *curOffset = (*curOffset + (int)local_220) - 1U & local_1cc;
      return;
    }
    DVar6 = (type->m_data).basicType;
    paVar1 = &local_1a8.name.field_2;
    local_1a8.name._M_string_length = 0;
    local_1a8.name.field_2._M_allocated_capacity =
         (ulong)(uint7)local_1a8.name.field_2._M_allocated_capacity._1_7_ << 8;
    local_1a8.type = TYPE_LAST;
    local_1a8.size = 0;
    local_1a8.blockNdx = -1;
    local_1a8.offset = -1;
    local_1a8.arrayStride = -1;
    local_1a8.matrixStride = -1;
    local_1a8.isRowMajor = false;
    local_1a8.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_assign((string *)&local_1a8);
    local_1a8.size = 1;
    local_1a8.type = DVar6;
    local_1a8.arrayStride = 0;
    local_1a8.matrixStride = 0;
    if (DVar6 - TYPE_FLOAT_MAT2 < 9 || DVar6 - TYPE_DOUBLE_MAT2 < 9) {
      if ((layoutFlags & 0x40) == 0) {
        local_1a8.blockNdx = curBlockNdx;
        iVar4 = glu::getDataTypeMatrixNumRows(DVar6);
        iVar5 = glu::getDataTypeMatrixNumColumns(DVar6);
      }
      else {
        local_1a8.blockNdx = curBlockNdx;
        iVar4 = glu::getDataTypeMatrixNumColumns(DVar6);
        iVar5 = glu::getDataTypeMatrixNumRows(DVar6);
      }
      DVar6 = glu::getDataTypeFloatVec(iVar4);
      iVar7 = glu::getDataTypeScalarSize(DVar6);
      iVar4 = 0x10;
      if (0x10 < iVar7 * 4) {
        iVar4 = iVar7 * 4;
      }
      local_1a8.offset = *curOffset;
      local_1a8.matrixStride = iVar4;
      local_1a8.isRowMajor = SUB41((layoutFlags & 0x40) >> 6,0);
      iVar4 = iVar4 * iVar5 + local_1a8.offset;
    }
    else {
      local_1a8.offset = *curOffset;
      local_1a8.blockNdx = curBlockNdx;
      iVar4 = glu::getDataTypeScalarSize(DVar6);
      iVar4 = iVar4 * 4 + *curOffset;
    }
    *curOffset = iVar4;
    std::
    vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>::
    push_back(&local_218->uniforms,&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.name._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(local_1a8.name._M_dataplus._M_p,local_1a8.name.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void computeStd140Layout (UniformLayout& layout, int& curOffset, int curBlockNdx, const std::string& curPrefix, const VarType& type, deUint32 layoutFlags)
{
	int baseAlignment = computeStd140BaseAlignment(type);

	curOffset = deAlign32(curOffset, baseAlignment);

	if (type.isBasicType())
	{
		glu::DataType		basicType	= type.getBasicType();
		UniformLayoutEntry	entry;

		entry.name			= curPrefix;
		entry.type			= basicType;
		entry.size			= 1;
		entry.arrayStride	= 0;
		entry.matrixStride	= 0;
		entry.blockNdx		= curBlockNdx;

		if (glu::isDataTypeMatrix(basicType))
		{
			// Array of vectors as specified in rules 5 & 7.
			bool	isRowMajor	= !!(layoutFlags & LAYOUT_ROW_MAJOR);
			int		vecSize		= isRowMajor ? glu::getDataTypeMatrixNumColumns(basicType)
											 : glu::getDataTypeMatrixNumRows(basicType);
			int		numVecs		= isRowMajor ? glu::getDataTypeMatrixNumRows(basicType)
											 : glu::getDataTypeMatrixNumColumns(basicType);
			int		stride		= getDataTypeArrayStride(glu::getDataTypeFloatVec(vecSize));

			entry.offset		= curOffset;
			entry.matrixStride	= stride;
			entry.isRowMajor	= isRowMajor;

			curOffset += numVecs*stride;
		}
		else
		{
			// Scalar or vector.
			entry.offset = curOffset;

			curOffset += getDataTypeByteSize(basicType);
		}

		layout.uniforms.push_back(entry);
	}
	else if (type.isArrayType())
	{
		const VarType&	elemType	= type.getElementType();

		if (elemType.isBasicType() && !glu::isDataTypeMatrix(elemType.getBasicType()))
		{
			// Array of scalars or vectors.
			glu::DataType		elemBasicType	= elemType.getBasicType();
			UniformLayoutEntry	entry;
			int					stride			= getDataTypeArrayStride(elemBasicType);

			entry.name			= curPrefix + "[0]"; // Array uniforms are always postfixed with [0]
			entry.type			= elemBasicType;
			entry.blockNdx		= curBlockNdx;
			entry.offset		= curOffset;
			entry.size			= type.getArraySize();
			entry.arrayStride	= stride;
			entry.matrixStride	= 0;

			curOffset += stride*type.getArraySize();

			layout.uniforms.push_back(entry);
		}
		else if (elemType.isBasicType() && glu::isDataTypeMatrix(elemType.getBasicType()))
		{
			// Array of matrices.
			glu::DataType		elemBasicType	= elemType.getBasicType();
			bool				isRowMajor		= !!(layoutFlags & LAYOUT_ROW_MAJOR);
			int					vecSize			= isRowMajor ? glu::getDataTypeMatrixNumColumns(elemBasicType)
															 : glu::getDataTypeMatrixNumRows(elemBasicType);
			int					numVecs			= isRowMajor ? glu::getDataTypeMatrixNumRows(elemBasicType)
															 : glu::getDataTypeMatrixNumColumns(elemBasicType);
			int					stride			= getDataTypeArrayStride(glu::getDataTypeFloatVec(vecSize));
			UniformLayoutEntry	entry;

			entry.name			= curPrefix + "[0]"; // Array uniforms are always postfixed with [0]
			entry.type			= elemBasicType;
			entry.blockNdx		= curBlockNdx;
			entry.offset		= curOffset;
			entry.size			= type.getArraySize();
			entry.arrayStride	= stride*numVecs;
			entry.matrixStride	= stride;
			entry.isRowMajor	= isRowMajor;

			curOffset += numVecs*type.getArraySize()*stride;

			layout.uniforms.push_back(entry);
		}
		else
		{
			DE_ASSERT(elemType.isStructType() || elemType.isArrayType());

			for (int elemNdx = 0; elemNdx < type.getArraySize(); elemNdx++)
				computeStd140Layout(layout, curOffset, curBlockNdx, curPrefix + "[" + de::toString(elemNdx) + "]", type.getElementType(), layoutFlags);
		}
	}
	else
	{
		DE_ASSERT(type.isStructType());

		for (StructType::ConstIterator memberIter = type.getStruct().begin(); memberIter != type.getStruct().end(); memberIter++)
			computeStd140Layout(layout, curOffset, curBlockNdx, curPrefix + "." + memberIter->getName(), memberIter->getType(), layoutFlags);

		curOffset = deAlign32(curOffset, baseAlignment);
	}
}